

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel_p.h
# Opt level: O1

void __thiscall
QFileSystemModelPrivate::QFileSystemNode::retranslateStrings
          (QFileSystemNode *this,QAbstractFileIconProvider *iconProvider,QString *path)

{
  QExtendedInformation *pQVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QFileSystemNode *this_00;
  ulong uVar5;
  char cVar6;
  Data *pDVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QString local_68;
  undefined1 local_50 [16];
  QFileSystemNode *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (iconProvider == (QAbstractFileIconProvider *)0x0) goto LAB_0062648a;
  if (this->info != (QExtendedInformation *)0x0) {
    QFileInfo::QFileInfo((QFileInfo *)local_50,path);
    (*iconProvider->_vptr_QAbstractFileIconProvider[4])
              (&local_68,iconProvider,(QFileInfo *)local_50);
    pQVar1 = this->info;
    pQVar2 = &((pQVar1->displayType).d.d)->super_QArrayData;
    (pQVar1->displayType).d.d = local_68.d.d;
    pcVar3 = (pQVar1->displayType).d.ptr;
    (pQVar1->displayType).d.ptr = local_68.d.ptr;
    qVar4 = (pQVar1->displayType).d.size;
    (pQVar1->displayType).d.size = local_68.d.size;
    local_68.d.d = (Data *)pQVar2;
    local_68.d.ptr = pcVar3;
    local_68.d.size = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    QFileInfo::~QFileInfo((QFileInfo *)local_50);
  }
  pDVar7 = (this->children).d;
  if (pDVar7 == (Data *)0x0) {
    pDVar7 = (Data *)0x0;
LAB_0062636d:
    uVar8 = 0;
  }
  else {
    if (pDVar7->spans->offsets[0] != 0xff) goto LAB_0062636d;
    uVar5 = 1;
    do {
      uVar8 = uVar5;
      if (pDVar7->numBuckets == uVar8) {
        pDVar7 = (Data *)0x0;
        uVar8 = 0;
        break;
      }
      uVar5 = uVar8 + 1;
    } while (pDVar7->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
  }
  if (uVar8 != 0 || pDVar7 != (Data *)0x0) {
    do {
      this_00 = *(QFileSystemNode **)
                 (pDVar7->spans[uVar8 >> 7].entries
                  [pDVar7->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f]].storage.data + 0x18);
      if ((path->d).size == 0) {
        retranslateStrings(this_00,iconProvider,&this_00->fileName);
      }
      else {
        cVar6 = QString::endsWith((QChar)(char16_t)path,0x2f);
        local_50._0_8_ = path;
        if (cVar6 == '\0') {
          local_50._8_2_ = 0x2f;
          local_40 = this_00;
          QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString_&>::convertTo<QString>
                    (&local_68,
                     (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString_&> *)
                     local_50);
        }
        else {
          local_50._8_8_ = this_00;
          QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                    (&local_68,(QStringBuilder<const_QString_&,_QString_&> *)local_50);
        }
        retranslateStrings(this_00,iconProvider,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      do {
        if (pDVar7->numBuckets - 1 == uVar8) {
          uVar8 = 0;
          pDVar7 = (Data *)0x0;
          break;
        }
        uVar8 = uVar8 + 1;
      } while (pDVar7->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
    } while ((uVar8 != 0) || (pDVar7 != (Data *)0x0));
  }
LAB_0062648a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void retranslateStrings(QAbstractFileIconProvider *iconProvider, const QString &path) {
            if (!iconProvider)
                return;

            if (info)
                info->displayType = iconProvider->type(QFileInfo(path));
            for (QFileSystemNode *child : std::as_const(children)) {
                //On windows the root (My computer) has no path so we don't want to add a / for nothing (e.g. /C:/)
                if (!path.isEmpty()) {
                    if (path.endsWith(u'/'))
                        child->retranslateStrings(iconProvider, path + child->fileName);
                    else
                        child->retranslateStrings(iconProvider, path + u'/' + child->fileName);
                } else
                    child->retranslateStrings(iconProvider, child->fileName);
            }
        }